

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall
mocker::ir::Interpreter::executePhis
          (Interpreter *this,
          vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
          *phis)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **pp_Var1;
  element_type *peVar2;
  pointer ppVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  Interpreter *pIVar7;
  int64_t iVar8;
  ulong uVar9;
  pointer pCVar10;
  pointer pCVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer pCVar12;
  long lVar13;
  ulong uVar14;
  pointer psVar15;
  pointer reg;
  pointer pCVar16;
  Change *change;
  pointer pCVar17;
  vector<Change,_std::allocator<Change>_> local_78;
  _Elt_pointer local_58;
  Interpreter *local_50;
  pointer local_48;
  ulong local_40;
  pointer local_38;
  
  local_78.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58 = (this->ars).c.
             super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_58 ==
      (this->ars).c.
      super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    local_58 = (this->ars).c.
               super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
  }
  psVar15 = (phis->
            super__Vector_base<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (phis->
             super__Vector_base<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pIVar7 = this;
  if (psVar15 != local_38) {
    do {
      local_50 = pIVar7;
      pCVar17 = local_78.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                super__Vector_impl_data._M_finish;
      peVar2 = (psVar15->super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      reg = (peVar2->options).
            super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (peVar2->options).
               super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (reg == ppVar3) {
LAB_0010a252:
        __assert_fail("found",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                      ,0x1bb,
                      "void mocker::ir::Interpreter::executePhis(const std::vector<std::shared_ptr<Phi>> &)"
                     );
      }
      while (((reg->second).super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->id != local_58[-1].lastBB) {
        reg = reg + 1;
        if (reg == ppVar3) goto LAB_0010a252;
      }
      iVar8 = readVal(this,&reg->first);
      peVar2 = (psVar15->super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (pCVar17 ==
          local_78.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        if ((long)pCVar17 -
            (long)local_78.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                  super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        lVar13 = (long)pCVar17 -
                 (long)local_78.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        uVar14 = lVar13 * -0x5555555555555555;
        uVar9 = uVar14;
        if (pCVar17 ==
            local_78.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar9 = 1;
        }
        local_40 = uVar9 + uVar14;
        if (0x555555555555554 < local_40) {
          local_40 = 0x555555555555555;
        }
        if (CARRY8(uVar9,uVar14)) {
          local_40 = 0x555555555555555;
        }
        if (local_40 == 0) {
          pCVar10 = (pointer)0x0;
          pCVar16 = local_78.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        else {
          local_48 = local_78.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pCVar10 = (pointer)operator_new(local_40 * 0x18);
          pCVar16 = local_48;
        }
        peVar4 = (peVar2->super_Definition).dest.
                 super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var5 = (peVar2->super_Definition).dest.
                 super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          }
        }
        pp_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  (&(pCVar10->reg).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + lVar13);
        *pp_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4;
        pp_Var1[1] = p_Var5;
        pp_Var1[2] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar8;
        pCVar12 = pCVar10;
        for (pCVar11 = pCVar16; pCVar17 != pCVar11; pCVar11 = pCVar11 + 1) {
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (pCVar11->reg).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          p_Var6 = (pCVar11->reg).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          (pCVar11->reg).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (pCVar12->reg).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var5;
          (pCVar12->reg).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Var6;
          (pCVar11->reg).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          pCVar12->val = pCVar11->val;
          pCVar12 = pCVar12 + 1;
        }
        if (pCVar16 != (pointer)0x0) {
          operator_delete(pCVar16,(long)local_78.super__Vector_base<Change,_std::allocator<Change>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pCVar16);
        }
        local_78.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = pCVar10 + local_40;
        this = local_50;
        local_78.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.super__Vector_impl_data
        ._M_start = pCVar10;
      }
      else {
        peVar4 = (peVar2->super_Definition).dest.
                 super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var5 = (peVar2->super_Definition).dest.
                 super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        pCVar12 = pCVar17;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
            pCVar12 = local_78.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          else {
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          }
        }
        (pCVar17->reg).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &peVar4->super_Addr;
        (pCVar17->reg).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = p_Var5;
        pCVar17->val = iVar8;
      }
      pCVar12 = pCVar12 + 1;
      psVar15 = psVar15 + 1;
      pCVar17 = local_78.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_78.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.super__Vector_impl_data.
      _M_finish = pCVar12;
      pIVar7 = local_50;
    } while (psVar15 != local_38);
    for (; pCVar17 != pCVar12; pCVar17 = pCVar17 + 1) {
      writeReg<long>(this,&pCVar17->reg,pCVar17->val);
    }
  }
  std::vector<Change,_std::allocator<Change>_>::~vector(&local_78);
  return;
}

Assistant:

void Interpreter::executePhis(const std::vector<std::shared_ptr<Phi>> &phis) {
  struct Change {
    Change(std::shared_ptr<Addr> reg, int64_t val)
        : reg(std::move(reg)), val(val) {}
    std::shared_ptr<Addr> reg;
    std::int64_t val;
  };
  std::vector<Change> changes;
  auto &ar = ars.top();

  for (const auto &p : phis) {
    bool found = false;
    for (auto &option : p->getOptions()) {
      if (option.second->getID() == ar.lastBB) {
        auto val = readVal(option.first);
        changes.emplace_back(p->getDest(), (std::int64_t)val);
        found = true;
        break;
      }
    }
    assert(found);
  }

  for (const auto &change : changes) {
    writeReg(change.reg, change.val);
  }
}